

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  char *local_28;
  undefined4 local_20;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"boolean value: ");
  poVar2 = std::ostream::_M_insert<bool>(SUB81(poVar2,0));
  std::operator<<(poVar2,'\n');
  std::operator<<((ostream *)&std::cout,"b4 is false\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"integer value: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0);
  poVar2 = std::operator<<(poVar2,' ');
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2,'\n');
  poVar2 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
  std::operator<<(poVar2,'\n');
  only_unsigned((unsigned_t)0xff);
  bVar1 = type_safe::detail::will_multiplication_error<int>(4,0xffffffffffffffff);
  if (!bVar1) {
    bVar1 = type_safe::detail::will_multiplication_error<int>(0xfffffffffffffffc,0xffffffffffffffff)
    ;
    if (!bVar1) {
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      poVar2 = std::operator<<(poVar2,' ');
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2,'\n');
      poVar2 = std::operator<<((ostream *)&std::cout,'7');
      std::operator<<(poVar2,'\n');
      poVar2 = std::operator<<((ostream *)&std::cout,"floating point value: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0.0);
      std::operator<<(poVar2,' ');
      poVar2 = std::ostream::_M_insert<double>(0.0);
      std::operator<<(poVar2,' ');
      poVar2 = std::ostream::_M_insert<double>(0.0);
      std::operator<<(poVar2,'\n');
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      poVar2 = std::operator<<(poVar2,' ');
      poVar2 = std::operator<<(poVar2,'d');
      std::operator<<(poVar2,'\n');
      poVar2 = std::ostream::_M_insert<double>(0.5);
      poVar2 = std::operator<<(poVar2,' ');
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0.5);
      std::operator<<(poVar2,'\n');
      return 0;
    }
  }
  local_28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/arithmetic_policy.hpp"
  ;
  local_20 = 0xa3;
  debug_assert::detail::
  do_assert<bool(),type_safe::detail::precondition_error_handler,char_const(&)[39]>
            (debug_assert::detail::always_false,&local_28,"",
             "multiplication will result in overflow");
  __cxa_begin_catch();
  std::terminate();
}

Assistant:

int main()
{
    using namespace ts::literals; // for the literal operators

    //=== type safe boolean ===//
    // ts::bool_t is alias for ts::boolean
    ts::bool_t b1(true);
    //    ts::bool_t b2;    // error: no default constructor
    //    ts::bool_t b3(0); // error: 0 is not a bool
    std::cout << "boolean value: " << b1 << '\n';

    ts::bool_t b4 = !b1;
    if (b4)
        std::cout << "b4 is true\n";
    else
        std::cout << "b4 is false\n";

    //    b4 + 0; // error: arithmetic not possible
    //    ++b4;   // error: arithmetic not possible

    //=== type safe integer ===//
    // ts::int_t is alias for ts::integer<int>
    // ts::unsigned_t is alias for ts::integer<unsigned>
    ts::int_t i1(0);
    //    ts::int_t i2;        // error: no default constructor
    //    ts::int_t i3(100ll); // error: long long -> int would be narrowing

    ts::unsigned_t u1(0u);
    //    ts::unsigned_t u2;    // error: no default constructor
    //    ts::unsigned_t u3(0); // error: 0 is signed

    std::cout << "integer value: " << i1 << ' ' << u1 << '\n';

    i1 += 4;
    ts::integer<long long> i4 = i1 + 100ll; // 100ll is long long, so result is long long
    std::cout << i4 << '\n';

    //    --u1; // runtime error: unsigned underflow
    //    -u1;  // error: no unary minus for unsigned

    ts::uint8_t u4(255_u8); // instead of std::uint8_t(255)
    //    u4 += 2;  // error: 2 is signed
    //    u4 += 2_u8; // runtime error: unsigned overflow

    //    only_unsigned(-4); // error: -4 is not unsigned
    //    only_unsigned(10); // error: 10 is not unsigned
    //    only_unsigned(i1); // error: i1 is not unsigned
    only_unsigned(u4);

    ts::unsigned_t u5 = ts::make_unsigned(i1);
    //    ts::unsigned_t u6 = ts::make_unsigned(-i1); // runtime error: value does not fit
    ts::unsigned_t u7 = ts::abs(-i1); // but this works and returns an the unsigned integer
    std::cout << u5 << ' ' << u7 << '\n';

    //    ts::int8_t i5 = ts::make_signed(u4); // runtime error: value does not fit
    ts::int8_t i6 = ts::make_signed(u4 - 200_u8);
    std::cout << i6 << '\n';

    //=== type safe floating points ===//
    // ts::float_t is alias for ts::floating_point<std::float_t> (std::float_t is float)
    // ts::double_t is alias for ts::floating_point<std::double_t> (std::double_t is double)
    ts::float_t f1(0.f);
    //    ts::float_t f2;     // error: no default constructor
    //    ts::float_t f3(0.); // error: 0. is double literal

    ts::double_t d1(0.);
    //    ts::double_t d2;      // error: no default constructor
    ts::double_t d3(0.f); // okay: float -> double is allowed

    std::cout << "floating point value: " << f1 << ' ' << d1 << ' ' << d3 << '\n';

    //    f1++;      // error: no in/decrement for floats
    //    f1 == 0.f; // error: no equality comparison for floats

    //=== narrow cast ===//
    ts::uint32_t uint32_val(325_u32);
    //    ts::uint8_t  uint8_val1 =
    //        ts::narrow_cast<ts::uint8_t>(uint32_val); // runtime error: value does not fit
    uint32_val             = 100_u32;
    ts::uint8_t uint8_val2 = ts::narrow_cast<ts::uint8_t>(uint32_val); // works
    std::cout << uint32_val << ' ' << uint8_val2 << '\n';

    ts::double_t double_val(0.1);
    //    ts::float_t  float_val1 =
    //        ts::narrow_cast<ts::float_t>(double_val); // runtime error: 0.1 is not exact
    double_val             = 0.5;
    ts::float_t float_val2 = ts::narrow_cast<ts::float_t>(double_val); // works, 0.5 is exact
    std::cout << double_val << ' ' << float_val2 << '\n';
}